

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreStructs.cpp
# Opt level: O0

void __thiscall
Assimp::Ogre::Bone::CalculateWorldMatrixAndDefaultPose(Bone *this,Skeleton *skeleton)

{
  bool bVar1;
  aiMatrix4x4t<float> *paVar2;
  reference puVar3;
  DeadlyImportError *this_00;
  basic_formatter<char,std::char_traits<char>,std::allocator<char>> *pbVar4;
  basic_formatter *this_01;
  basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_> local_2d8;
  string local_160;
  Bone *local_140;
  Bone *child;
  iterator iStack_130;
  unsigned_short boneId;
  iterator __end2;
  iterator __begin2;
  vector<unsigned_short,_std::allocator<unsigned_short>_> *__range2;
  aiMatrix4x4t<float> local_d8;
  aiMatrix4x4t<float> local_98;
  aiMatrix4x4t<float> local_58;
  Skeleton *local_18;
  Skeleton *skeleton_local;
  Bone *this_local;
  
  local_18 = skeleton;
  skeleton_local = (Skeleton *)this;
  bVar1 = IsParented(this);
  if (bVar1) {
    aiMatrix4x4t<float>::aiMatrix4x4t(&local_d8,&this->scale,&this->rotation,&this->position);
    paVar2 = aiMatrix4x4t<float>::Inverse(&local_d8);
    aiMatrix4x4t<float>::operator*(&local_98,paVar2,&this->parent->worldMatrix);
    memcpy(&this->worldMatrix,&local_98,0x40);
  }
  else {
    aiMatrix4x4t<float>::aiMatrix4x4t(&local_58,&this->scale,&this->rotation,&this->position);
    paVar2 = aiMatrix4x4t<float>::Inverse(&local_58);
    memcpy(&this->worldMatrix,paVar2,0x40);
  }
  aiMatrix4x4t<float>::aiMatrix4x4t
            ((aiMatrix4x4t<float> *)&__range2,&this->scale,&this->rotation,&this->position);
  memcpy(&this->defaultPose,&__range2,0x40);
  __end2 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::begin(&this->children);
  iStack_130 = std::vector<unsigned_short,_std::allocator<unsigned_short>_>::end(&this->children);
  while( true ) {
    bVar1 = __gnu_cxx::operator!=(&__end2,&stack0xfffffffffffffed0);
    if (!bVar1) {
      return;
    }
    puVar3 = __gnu_cxx::
             __normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
             ::operator*(&__end2);
    child._6_2_ = *puVar3;
    local_140 = Skeleton::BoneById(local_18,child._6_2_);
    if (local_140 == (Bone *)0x0) break;
    CalculateWorldMatrixAndDefaultPose(local_140,local_18);
    __gnu_cxx::
    __normal_iterator<unsigned_short_*,_std::vector<unsigned_short,_std::allocator<unsigned_short>_>_>
    ::operator++(&__end2);
  }
  this_00 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
  Formatter::basic_formatter<char,_std::char_traits<char>,_std::allocator<char>_>::basic_formatter
            (&local_2d8);
  pbVar4 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
           Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator<<
                     ((basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
                      &local_2d8,
                      (char (*) [63])
                      "CalculateWorldMatrixAndDefaultPose: Failed to find child bone ");
  pbVar4 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
           Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator<<
                     (pbVar4,(unsigned_short *)((long)&child + 6));
  pbVar4 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
           Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator<<
                     (pbVar4,(char (*) [13])" for parent ");
  pbVar4 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
           Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator<<
                     (pbVar4,&this->id);
  pbVar4 = (basic_formatter<char,std::char_traits<char>,std::allocator<char>> *)
           Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator<<
                     (pbVar4,(char (*) [2])0xc5068d);
  this_01 = (basic_formatter *)
            Formatter::basic_formatter<char,std::char_traits<char>,std::allocator<char>>::operator<<
                      (pbVar4,&this->name);
  Formatter::basic_formatter::operator_cast_to_string(&local_160,this_01);
  DeadlyImportError::DeadlyImportError(this_00,&local_160);
  __cxa_throw(this_00,&DeadlyImportError::typeinfo,DeadlyImportError::~DeadlyImportError);
}

Assistant:

void Bone::CalculateWorldMatrixAndDefaultPose(Skeleton *skeleton)
{
    if (!IsParented())
        worldMatrix = aiMatrix4x4(scale, rotation, position).Inverse();
    else
        worldMatrix = aiMatrix4x4(scale, rotation, position).Inverse() * parent->worldMatrix;

    defaultPose = aiMatrix4x4(scale, rotation, position);

    // Recursively for all children now that the parent matrix has been calculated.
    for (auto boneId : children)
    {
        Bone *child = skeleton->BoneById(boneId);
        if (!child) {
            throw DeadlyImportError(Formatter::format() << "CalculateWorldMatrixAndDefaultPose: Failed to find child bone " << boneId << " for parent " << id << " " << name);
        }
        child->CalculateWorldMatrixAndDefaultPose(skeleton);
    }
}